

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O0

void InitCommandLine(int argc,char **argv,variables_map *conf)

{
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar1;
  char *pcVar2;
  typed_value<float,_char> *ptVar3;
  typed_value<unsigned_int,_char> *ptVar4;
  typed_value<double,_char> *ptVar5;
  typed_value<unsigned_int,_char> *desc;
  char *pcVar6;
  typed_value<unsigned_int,_char> *ext;
  typed_value<unsigned_int,_char> *ptVar7;
  size_type sVar8;
  void *this;
  key_type *__x;
  options_description *this_00;
  variables_map *in_RDX;
  options_description dcmdline_options;
  options_description opts;
  key_type *in_stack_fffffffffffffc08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffc10;
  allocator *paVar9;
  double *in_stack_fffffffffffffc28;
  typed_value<double,_char> *in_stack_fffffffffffffc30;
  int style;
  int argc_00;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  basic_parsed_options local_1b8 [40];
  options_description local_190 [132];
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined4 local_dc;
  undefined8 local_d8 [3];
  allocator local_b9;
  string local_b8 [32];
  options_description local_98 [128];
  variables_map *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Configuration options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,(value_semantic *)"training_data,T",(char *)ptVar1);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"dev_data,d",(char *)ptVar1);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"test_data,p",(char *)ptVar1);
  ptVar3 = boost::program_options::value<float>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"dropout,D",(char *)ptVar3);
  boost::program_options::value<unsigned_int>();
  local_dc = 1;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"unk_strategy,o",(char *)ptVar4);
  boost::program_options::value<double>();
  local_e8 = 0x3fc999999999999a;
  ptVar5 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"unk_prob,u",(char *)ptVar5);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"model,m",(char *)ptVar1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"use_pos_tags,P");
  boost::program_options::value<unsigned_int>();
  local_ec = 1;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"beam_size,b",(char *)ptVar4);
  boost::program_options::value<unsigned_int>();
  local_f0 = 2;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)0x18e22e,(char *)ptVar4);
  boost::program_options::value<unsigned_int>();
  local_f4 = 0x10;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"action_dim",(char *)ptVar4);
  ptVar4 = boost::program_options::value<unsigned_int>();
  local_f8 = 0x20;
  desc = boost::program_options::typed_value<unsigned_int,_char>::default_value
                   ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                    (uint *)in_stack_fffffffffffffc28);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)0x18e2e7,(char *)desc);
  argc_00 = (int)((ulong)pcVar2 >> 0x20);
  ext = boost::program_options::value<unsigned_int>();
  local_fc = 0x40;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"hidden_dim",(char *)ptVar7);
  style = (int)((ulong)pcVar6 >> 0x20);
  boost::program_options::value<unsigned_int>();
  local_100 = 0x32;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"pretrained_dim",(char *)ptVar7);
  boost::program_options::value<unsigned_int>();
  local_104 = 0xc;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"pos_dim",(char *)ptVar7);
  boost::program_options::value<unsigned_int>();
  local_108 = 10;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"rel_dim",(char *)ptVar7);
  boost::program_options::value<unsigned_int>();
  local_10c = 0x3c;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffffc30,
                      (uint *)in_stack_fffffffffffffc28);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"lstm_input_dim",(char *)ptVar7);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"train,t");
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"words,w",(char *)ptVar1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"use_spelling,S");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  boost::program_options::options_description::options_description
            (local_190,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  boost::program_options::options_description::add(local_190);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x15553a);
  boost::program_options::parse_command_line<char>
            (argc_00,(char **)ptVar4,(options_description *)desc,style,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)ext);
  boost::program_options::store(local_1b8,local_18,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x15558d);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x15559a);
  paVar9 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"help",paVar9);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  if (sVar8 != 0) {
    this = (void *)boost::program_options::operator<<((ostream *)&std::cerr,local_190);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __x = (key_type *)(local_18 + 0x10);
  paVar9 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"training_data",paVar9);
  this_00 = (options_description *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)paVar9,__x);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  if (this_00 == (options_description *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n"
                   );
    exit(1);
  }
  boost::program_options::options_description::~options_description(this_00);
  boost::program_options::options_description::~options_description(this_00);
  return;
}

Assistant:

void InitCommandLine(int argc, char** argv, po::variables_map* conf) {
  po::options_description opts("Configuration options");
  opts.add_options()
        ("training_data,T", po::value<string>(), "List of Transitions - Training corpus")
        ("dev_data,d", po::value<string>(), "Development corpus")
        ("test_data,p", po::value<string>(), "Test corpus")
        ("dropout,D", po::value<float>(), "Dropout rate")
        ("unk_strategy,o", po::value<unsigned>()->default_value(1), "Unknown word strategy: 1 = singletons become UNK with probability unk_prob")
        ("unk_prob,u", po::value<double>()->default_value(0.2), "Probably with which to replace singletons with UNK in training data")
        ("model,m", po::value<string>(), "Load saved model from this file")
        ("use_pos_tags,P", "make POS tags visible to parser")
        ("beam_size,b", po::value<unsigned>()->default_value(1), "beam size")
        ("layers", po::value<unsigned>()->default_value(2), "number of LSTM layers")
        ("action_dim", po::value<unsigned>()->default_value(16), "action embedding size")
        ("input_dim", po::value<unsigned>()->default_value(32), "input embedding size")
        ("hidden_dim", po::value<unsigned>()->default_value(64), "hidden dimension")
        ("pretrained_dim", po::value<unsigned>()->default_value(50), "pretrained input dimension")
        ("pos_dim", po::value<unsigned>()->default_value(12), "POS dimension")
        ("rel_dim", po::value<unsigned>()->default_value(10), "relation dimension")
        ("lstm_input_dim", po::value<unsigned>()->default_value(60), "LSTM input dimension")
        ("train,t", "Should training be run?")
        ("words,w", po::value<string>(), "Pretrained word embeddings")
        ("use_spelling,S", "Use spelling model") //Miguel. Spelling model
        ("help,h", "Help");
  po::options_description dcmdline_options;
  dcmdline_options.add(opts);
  po::store(parse_command_line(argc, argv, dcmdline_options), *conf);
  if (conf->count("help")) {
    cerr << dcmdline_options << endl;
    exit(1);
  }
  if (conf->count("training_data") == 0) {
    cerr << "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n";
    exit(1);
  }
}